

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

bool duckdb::GreaterThan::Operation<float>(float *left,float *right)

{
  bool bVar1;
  
  bVar1 = GreaterThanFloat<float>(*left,*right);
  return bVar1;
}

Assistant:

bool GreaterThan::Operation(const float &left, const float &right) {
	return GreaterThanFloat<float>(left, right);
}